

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

bool cfd::core::Pubkey::IsValid(ByteData *byte_data)

{
  byte bVar1;
  bool bVar2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_20,byte_data);
  if (local_20._M_impl.super__Vector_impl_data._M_finish ==
      local_20._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = false;
  }
  else {
    bVar1 = *local_20._M_impl.super__Vector_impl_data._M_start;
    if ((bVar1 & 0xfe) == 2) {
      bVar2 = (long)local_20._M_impl.super__Vector_impl_data._M_finish -
              (long)local_20._M_impl.super__Vector_impl_data._M_start == 0x21;
    }
    else {
      bVar2 = false;
      if ((bVar1 < 8) && ((0xd0U >> (bVar1 & 0x1f) & 1) != 0)) {
        bVar2 = (long)local_20._M_impl.super__Vector_impl_data._M_finish -
                (long)local_20._M_impl.super__Vector_impl_data._M_start == 0x41;
      }
    }
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_20);
  return bVar2;
}

Assistant:

bool Pubkey::IsValid(const ByteData &byte_data) {
  const std::vector<uint8_t> &buffer = byte_data.GetBytes();
  if (buffer.size() > 0) {
    uint8_t header = buffer[0];
    if (header == 0x02 || header == 0x03) {
      return buffer.size() == Pubkey::kCompressedPubkeySize;
    } else if (header == 0x04 || header == 0x06 || header == 0x07) {
      return buffer.size() == Pubkey::kPubkeySize;
    }
  }
  return false;
}